

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::detail::const_var_impl<chaiscript::Type_Info>(detail *this,Type_Info *t)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  undefined1 local_28 [24];
  Type_Info *t_local;
  
  local_28._16_8_ = t;
  t_local = (Type_Info *)this;
  std::make_shared<chaiscript::Type_Info_const,chaiscript::Type_Info_const&>((Type_Info *)local_28);
  Boxed_Value::Boxed_Value<std::shared_ptr<chaiscript::Type_Info_const>,void>
            ((Boxed_Value *)this,(shared_ptr<const_chaiscript::Type_Info> *)local_28,false);
  Catch::clara::std::shared_ptr<const_chaiscript::Type_Info>::~shared_ptr
            ((shared_ptr<const_chaiscript::Type_Info> *)local_28);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value const_var_impl(const T &t) {
      return Boxed_Value(std::make_shared<typename std::add_const<T>::type>(t));
    }